

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  U32 UVar2;
  undefined8 uVar3;
  seqStore_t *psVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  BYTE *pBVar9;
  seqDef *psVar10;
  U32 UVar11;
  BYTE *pBVar12;
  uint uVar13;
  int iVar14;
  int *ip;
  uint uVar15;
  ulong uVar16;
  int *piVar17;
  int *iend;
  uint uVar18;
  int *ip_00;
  BYTE *litEnd;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint local_104;
  size_t ofbCandidate;
  ulong local_f0;
  ulong local_e8;
  BYTE *local_e0;
  int local_d8;
  uint local_d4;
  int *local_d0;
  ZSTD_matchState_t *local_c8;
  BYTE *local_c0;
  BYTE *local_b8;
  seqStore_t *local_b0;
  BYTE *local_a8;
  U32 maxDistance;
  int *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  BYTE *litLimit_w;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  U32 *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e0 = (ms->window).base;
  local_b8 = (ms->window).dictBase;
  uVar18 = (ms->window).dictLimit;
  local_f0 = (ulong)uVar18;
  local_a8 = local_b8 + local_f0;
  local_70 = local_b8 + (ms->window).lowLimit;
  uVar5 = (ms->cParams).windowLog;
  uVar13 = (ms->cParams).minMatch;
  uVar15 = 6;
  if (uVar13 < 6) {
    uVar15 = uVar13;
  }
  local_d4 = 4;
  if (4 < uVar15) {
    local_d4 = uVar15;
  }
  uVar13 = *rep;
  local_104 = rep[1];
  ms->lazySkipping = 0;
  local_c0 = local_e0 + local_f0;
  uVar5 = 1 << ((byte)uVar5 & 0x1f);
  _maxDistance = (ulong)uVar5;
  iVar6 = (int)local_e0;
  local_60 = (ulong)(1 - (uVar5 + iVar6));
  ip = (int *)((ulong)(local_c0 == (BYTE *)src) + (long)src);
  iEnd = (BYTE *)((long)src + srcSize);
  local_98 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  local_58 = (ulong)(1 - iVar6);
  local_d8 = uVar18 - 1;
  local_68 = (ulong)((uVar18 + iVar6) - 2);
  uVar20 = (ulong)uVar13;
  local_c8 = ms;
  local_b0 = seqStore;
  local_50 = rep;
LAB_0039a521:
  do {
    local_e8 = uVar20;
    uVar18 = (uint)local_e8;
    if (local_98 <= ip) {
      *local_50 = uVar18;
      local_50[1] = local_104;
      return (long)iEnd - (long)src;
    }
    iVar14 = (int)ip;
    iVar6 = (iVar14 - (int)local_e0) + 1;
    UVar2 = (ms->window).lowLimit;
    UVar11 = iVar6 - (uint)_maxDistance;
    if (iVar6 - UVar2 <= (uint)_maxDistance) {
      UVar11 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar2;
    }
    uVar13 = iVar6 - uVar18;
    pBVar9 = local_b8;
    if ((uint)local_f0 <= uVar13) {
      pBVar9 = local_e0;
    }
    iend = (int *)((long)ip + 1);
    if (local_d8 - uVar13 < 3) {
LAB_0039a5bc:
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      if (uVar18 <= iVar6 - UVar11) {
        if (*iend != *(int *)(pBVar9 + uVar13)) goto LAB_0039a5bc;
        pBVar12 = local_a8;
        if ((uint)local_f0 <= uVar13) {
          pBVar12 = iEnd;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar9 + uVar13) + 4),iEnd,pBVar12
                           ,local_c0);
        uVar20 = sVar7 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (local_d4 == 6) {
      uVar8 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
    }
    else if (local_d4 == 5) {
      uVar8 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
    }
    else {
      uVar8 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
    }
    uVar19 = uVar20;
    if (uVar20 < uVar8) {
      uVar19 = uVar8;
    }
    if (uVar19 < 4) {
      uVar20 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar20 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar20);
      uVar20 = local_e8;
      goto LAB_0039a521;
    }
    uVar16 = 1;
    if (uVar20 < uVar8) {
      iend = ip;
      uVar16 = ofbCandidate;
    }
    local_38 = (ulong)(uint)((int)local_60 + iVar14);
    local_40 = (ulong)(uint)((int)local_58 + iVar14);
    uVar18 = ((int)local_68 + (int)local_e8) - iVar14;
    local_48 = (ulong)(uint)(((int)local_58 - (int)local_e8) + iVar14);
    piVar17 = ip;
    local_80 = (int *)src;
    for (lVar21 = 0; (int *)(lVar21 + (long)ip) < local_98; lVar21 = lVar21 + 1) {
      ip_00 = (int *)((long)ip + lVar21 + 1);
      local_d0 = iend;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        UVar2 = (ms->window).lowLimit;
        iVar14 = (int)lVar21;
        iVar6 = (int)local_40 + iVar14;
        UVar11 = (int)local_38 + iVar14;
        if (iVar6 - UVar2 <= maxDistance) {
          UVar11 = UVar2;
        }
        if (ms->loadedDictEnd != 0) {
          UVar11 = UVar2;
        }
        uVar13 = (int)local_48 + iVar14;
        pBVar9 = local_e0;
        if (uVar13 < (uint)local_f0) {
          pBVar9 = local_b8;
        }
        if (((2 < uVar18) && ((uint)local_e8 <= iVar6 - UVar11)) &&
           (*ip_00 == *(int *)(pBVar9 + uVar13))) {
          pBVar12 = iEnd;
          if (uVar13 < (uint)local_f0) {
            pBVar12 = local_a8;
          }
          local_90 = ip_00;
          local_88 = piVar17;
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)ip + lVar21 + 5),(BYTE *)((long)(pBVar9 + uVar13) + 4),
                             iEnd,pBVar12,local_c0);
          piVar17 = local_88;
          ip_00 = local_90;
          if (sVar7 < 0xfffffffffffffffc) {
            uVar13 = 0x1f;
            if ((uint)uVar16 != 0) {
              for (; (uint)uVar16 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)uVar19 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
              uVar16 = 1;
              local_d0 = local_90;
              uVar19 = sVar7 + 4;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (local_d4 == 6) {
        uVar20 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else if (local_d4 == 5) {
        uVar20 = ZSTD_HcFindBestMatch_extDict_5(local_c8,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else {
        uVar20 = ZSTD_HcFindBestMatch_extDict_4(local_c8,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      iend = local_d0;
      ms = local_c8;
      if (uVar20 < 4) break;
      uVar13 = 0x1f;
      if ((uint)uVar16 != 0) {
        for (; (uint)uVar16 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      iVar6 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      if ((int)uVar20 * 4 - iVar6 <= (int)((uVar13 ^ 0x1f) + (int)uVar19 * 4 + -0x1b)) break;
      iend = (int *)((long)piVar17 + 1);
      uVar18 = uVar18 - 1;
      uVar16 = ofbCandidate;
      piVar17 = iend;
      uVar19 = uVar20;
    }
    if (3 < uVar16) {
      uVar20 = (long)iend + (-(long)local_e0 - uVar16) + 3;
      pBVar12 = local_c0;
      pBVar9 = local_e0;
      if ((uint)uVar20 < (uint)local_f0) {
        pBVar12 = local_70;
        pBVar9 = local_b8;
      }
      pBVar9 = pBVar9 + (uVar20 & 0xffffffff);
      for (; ((local_80 < iend && (pBVar12 < pBVar9)) && (*(BYTE *)((long)iend + -1) == pBVar9[-1]))
          ; iend = (int *)((long)iend + -1)) {
        pBVar9 = pBVar9 + -1;
        uVar19 = uVar19 + 1;
      }
      local_104 = (uint)local_e8;
      local_e8 = (ulong)((U32)uVar16 - 3);
    }
    uVar20 = (long)iend - (long)local_80;
    pBVar9 = local_b0->lit;
    if (litLimit_w < iend) {
      ZSTD_safecopyLiterals(pBVar9,(BYTE *)local_80,(BYTE *)iend,litLimit_w);
LAB_0039a956:
      local_b0->lit = local_b0->lit + uVar20;
      psVar10 = local_b0->sequences;
      if (0xffff < uVar20) {
        local_b0->longLengthType = ZSTD_llt_literalLength;
        local_b0->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)local_b0->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)(local_80 + 2);
      *(undefined8 *)pBVar9 = *(undefined8 *)local_80;
      *(undefined8 *)(pBVar9 + 8) = uVar3;
      pBVar9 = local_b0->lit;
      if (0x10 < uVar20) {
        uVar3 = *(undefined8 *)(local_80 + 6);
        *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)(local_80 + 4);
        *(undefined8 *)(pBVar9 + 0x18) = uVar3;
        if (0x20 < (long)uVar20) {
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_80 + lVar21 + 0x20);
            uVar3 = puVar1[1];
            pBVar12 = pBVar9 + lVar21 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)local_80 + lVar21 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar3;
            lVar21 = lVar21 + 0x20;
          } while (pBVar12 + 0x20 < pBVar9 + uVar20);
        }
        goto LAB_0039a956;
      }
      local_b0->lit = pBVar9 + uVar20;
      psVar10 = local_b0->sequences;
    }
    psVar4 = local_b0;
    psVar10->litLength = (U16)uVar20;
    psVar10->offBase = (U32)uVar16;
    if (0xffff < uVar19 - 3) {
      local_b0->longLengthType = ZSTD_llt_matchLength;
      local_b0->longLengthPos = (U32)((ulong)((long)psVar10 - (long)local_b0->sequencesStart) >> 3);
    }
    psVar10->mlBase = (U16)(uVar19 - 3);
    local_b0->sequences = psVar10 + 1;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar20 = local_e8;
    for (ip = (int *)((long)iend + uVar19); uVar8 = (ulong)local_104, src = ip, ip <= local_98;
        ip = (int *)((long)ip + sVar7 + 4)) {
      iVar6 = (int)ip - (int)local_e0;
      UVar2 = (ms->window).lowLimit;
      UVar11 = iVar6 - (uint)_maxDistance;
      if (iVar6 - UVar2 <= (uint)_maxDistance) {
        UVar11 = UVar2;
      }
      if (ms->loadedDictEnd != 0) {
        UVar11 = UVar2;
      }
      uVar18 = iVar6 - local_104;
      pBVar9 = local_e0;
      if (uVar18 < (uint)local_f0) {
        pBVar9 = local_b8;
      }
      if (((local_d8 - uVar18 < 3) || (iVar6 - UVar11 < local_104)) ||
         (*ip != *(int *)(pBVar9 + uVar18))) break;
      pBVar12 = iEnd;
      if (uVar18 < (uint)local_f0) {
        pBVar12 = local_a8;
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar9 + uVar18) + 4),iEnd,pBVar12,
                         local_c0);
      pBVar9 = psVar4->lit;
      if (litLimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar9,(BYTE *)ip,(BYTE *)ip,litLimit_w);
      }
      else {
        uVar3 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar9 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar9 + 8) = uVar3;
      }
      psVar10 = psVar4->sequences;
      psVar10->litLength = 0;
      psVar10->offBase = 1;
      if (0xffff < sVar7 + 1) {
        psVar4->longLengthType = ZSTD_llt_matchLength;
        psVar4->longLengthPos = (U32)((ulong)((long)psVar10 - (long)psVar4->sequencesStart) >> 3);
      }
      psVar10->mlBase = (U16)(sVar7 + 1);
      psVar4->sequences = psVar10 + 1;
      local_104 = (uint)uVar20;
      uVar20 = uVar8;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}